

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::quadratic_cost_type
          (quadratic_cost_type<double> *this,objective_function *obj_,int n)

{
  int iVar1;
  pointer poVar2;
  pointer poVar3;
  ulong uVar4;
  double *pdVar5;
  quad *__s;
  int *__s_00;
  index *piVar6;
  undefined8 extraout_RAX;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  index *piVar12;
  ulong uVar13;
  ulong uVar14;
  
  this->obj = obj_;
  uVar14 = (long)n * 8;
  if (n < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar14);
  memset(pdVar5,0,uVar14);
  (this->linear_elements)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar5;
  uVar14 = (long)(obj_->qelements).
                 super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(obj_->qelements).
                 super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = uVar14 * 2 | 0x10;
  if (0x7ffffffffffffff8 < uVar14) {
    uVar13 = 0xffffffffffffffff;
  }
  __s = (quad *)operator_new__(uVar13);
  memset(__s,0,uVar13);
  (this->quadratic_elements)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>._M_head_impl =
       __s;
  uVar14 = (long)n * 4 + 4;
  if (n < -1) {
    uVar14 = 0xffffffffffffffff;
  }
  __s_00 = (int *)operator_new__(uVar14);
  memset(__s_00,0,uVar14);
  (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s_00;
  poVar2 = (obj_->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (long)(obj_->elements).
                 super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)poVar2;
  if ((uVar14 & 0xffffffff0) != 0) {
    uVar14 = uVar14 >> 4 & 0xffffffff;
    piVar6 = &poVar2->variable_index;
    do {
      lVar7 = (long)*piVar6;
      if ((lVar7 < 0) || (n <= *piVar6)) {
LAB_00180904:
        itm::quadratic_cost_type();
        operator_delete__(__s);
        (this->quadratic_elements)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
        _M_head_impl = (quad *)0x0;
        pdVar5 = (this->linear_elements)._M_t.
                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->linear_elements)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
        _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
        _Unwind_Resume(extraout_RAX);
      }
      pdVar5[lVar7] = ((objective_function_element *)(piVar6 + -2))->factor + pdVar5[lVar7];
      piVar6 = piVar6 + 4;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  *__s_00 = 0;
  if (n != 0) {
    poVar3 = (obj_->qelements).
             super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (long)(obj_->qelements).
                   super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)poVar3;
    uVar14 = 0;
    do {
      uVar10 = uVar14 + 1;
      (__s_00 + 1)[uVar14] = __s_00[uVar14];
      uVar11 = uVar13 >> 4 & 0xffffffff;
      piVar6 = &poVar3->variable_index_b;
      uVar4 = uVar13 & 0xffffffff0;
      while (uVar4 != 0) {
        iVar9 = piVar6[-1];
        if (((long)iVar9 < 0) || (n <= iVar9)) {
          itm::quadratic_cost_type();
LAB_001808ff:
          itm::quadratic_cost_type();
          goto LAB_00180904;
        }
        iVar8 = *piVar6;
        if (((long)iVar8 < 0) || (n <= iVar8)) goto LAB_001808ff;
        if (uVar14 == (long)iVar9 || uVar14 == (long)iVar8) {
          __s_00[uVar10] = __s_00[uVar10] + 1;
        }
        piVar6 = piVar6 + 4;
        uVar11 = uVar11 - 1;
        uVar4 = uVar11;
      }
      uVar14 = uVar10;
    } while (uVar10 != (uint)n);
    poVar3 = (obj_->qelements).
             super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = (long)(obj_->qelements).
                   super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)poVar3;
    iVar8 = 0;
    iVar9 = 0;
    do {
      uVar13 = uVar14 >> 4 & 0xffffffff;
      piVar6 = &poVar3->variable_index_b;
      uVar11 = uVar14 & 0xffffffff0;
      while (uVar11 != 0) {
        iVar1 = piVar6[-1];
        if ((iVar1 == iVar8) || (*piVar6 == iVar8)) {
          __s[iVar9].factor = ((objective_quadratic_element *)(piVar6 + -3))->factor;
          piVar12 = piVar6 + -1;
          if (iVar1 == iVar8) {
            piVar12 = piVar6;
          }
          __s[iVar9].id = *piVar12;
          iVar9 = iVar9 + 1;
        }
        piVar6 = piVar6 + 4;
        uVar13 = uVar13 - 1;
        uVar11 = uVar13;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != n);
  }
  return;
}

Assistant:

quadratic_cost_type(const objective_function& obj_, int n)
      : obj(obj_)
      , linear_elements(std::make_unique<Float[]>(n))
      , quadratic_elements(
          std::make_unique<quad[]>(2 * obj.qelements.size() + 1))
      , indices(std::make_unique<int[]>(n + 1))
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i) {
            bx_ensures(0 <= obj.elements[i].variable_index &&
                       obj.elements[i].variable_index < n);

            linear_elements[obj.elements[i].variable_index] +=
              static_cast<Float>(obj.elements[i].factor);
        }

        indices[0] = 0;
        for (int var = 0; var != n; ++var) {
            indices[var + 1] = indices[var];

            for (int i = 0, e = length(obj.qelements); i != e; ++i) {
                bx_ensures(0 <= obj.qelements[i].variable_index_a &&
                           obj.qelements[i].variable_index_a < n);
                bx_ensures(0 <= obj.qelements[i].variable_index_b &&
                           obj.qelements[i].variable_index_b < n);

                if (var == obj.qelements[i].variable_index_a ||
                    var == obj.qelements[i].variable_index_b)
                    ++indices[var + 1];
            }
        }

        for (int id = 0, var = 0; var != n; ++var) {
            for (int i = 0, e = length(obj.qelements); i != e; ++i) {
                const bool is_a = obj.qelements[i].variable_index_a == var;
                const bool is_b = obj.qelements[i].variable_index_b == var;

                if (is_a || is_b) {
                    quadratic_elements[id].factor =
                      static_cast<Float>(obj.qelements[i].factor);
                    quadratic_elements[id].id =
                      is_a ? obj.qelements[i].variable_index_b
                           : obj.qelements[i].variable_index_a;
                    ++id;
                }
            }
        }
    }